

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O3

Fad<double> * __thiscall
Fad<double>::operator=(Fad<double> *this,FadExpr<FadFuncSin<Fad<double>_>_> *fadexpr)

{
  uint uVar1;
  uint uVar2;
  double *pdVar3;
  double *pdVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  
  uVar1 = (fadexpr->fadexpr_).expr_.dx_.num_elts;
  uVar2 = (this->dx_).num_elts;
  if (uVar1 == uVar2) {
    if (uVar1 == 0) goto LAB_00f8361d;
    pdVar3 = (this->dx_).ptr_to_data;
  }
  else {
    if (uVar1 == 0) {
      if (uVar2 != 0) {
        pdVar3 = (this->dx_).ptr_to_data;
        if (pdVar3 != (double *)0x0) {
          operator_delete__(pdVar3);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
      goto LAB_00f8361d;
    }
    if (uVar2 != 0) {
      pdVar3 = (this->dx_).ptr_to_data;
      if (pdVar3 != (double *)0x0) {
        operator_delete__(pdVar3);
      }
      (this->dx_).ptr_to_data = (double *)0x0;
    }
    (this->dx_).num_elts = uVar1;
    uVar7 = (ulong)uVar1 * 8;
    uVar6 = 0xffffffffffffffff;
    if (-1 < (int)uVar1) {
      uVar6 = uVar7;
    }
    pdVar3 = (double *)operator_new__(uVar6);
    (this->dx_).ptr_to_data = pdVar3;
    if ((fadexpr->fadexpr_).expr_.dx_.num_elts == 0) {
      if (0 < (int)uVar1) {
        lVar5 = 0;
        do {
          pdVar4 = (double *)((long)(fadexpr->fadexpr_).expr_.dx_.ptr_to_data + lVar5);
          if ((fadexpr->fadexpr_).expr_.dx_.num_elts == 0) {
            pdVar4 = &(fadexpr->fadexpr_).expr_.defaultVal;
          }
          dVar9 = *pdVar4;
          dVar8 = cos((fadexpr->fadexpr_).expr_.val_);
          *(double *)((long)pdVar3 + lVar5) = dVar8 * dVar9;
          lVar5 = lVar5 + 8;
        } while (uVar7 - lVar5 != 0);
      }
      goto LAB_00f8361d;
    }
  }
  if (0 < (int)uVar1) {
    uVar7 = 0;
    do {
      dVar9 = (fadexpr->fadexpr_).expr_.dx_.ptr_to_data[uVar7];
      dVar8 = cos((fadexpr->fadexpr_).expr_.val_);
      pdVar3[uVar7] = dVar8 * dVar9;
      uVar7 = uVar7 + 1;
    } while (uVar1 != uVar7);
  }
LAB_00f8361d:
  dVar9 = sin((fadexpr->fadexpr_).expr_.val_);
  this->val_ = dVar9;
  return this;
}

Assistant:

inline Fad<T> & Fad<T>::operator=(const FadExpr<ExprT>& fadexpr) 
{
  int sz = fadexpr.size();

  if ( sz != dx_.size() ) dx_.resize(sz);

  if ( sz ) {
    T* RESTRICT dxp = dx_.begin();
    if (fadexpr.hasFastAccess())
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.fastAccessDx(i);
    else
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.dx(i);
  }
  
  val_ = fadexpr.val();
  
  return *this;
}